

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translations.c
# Opt level: O1

int gotcha_internal_libc_start_main
              (_func_int_int_char_ptr_ptr_char_ptr_ptr *main_arg,int argc,char **argv,
              _func_void_varargs *init,_func_void_varargs *fini,_func_void_varargs *rtld_fini,
              void *stack_end)

{
  int iVar1;
  code *UNRECOVERED_JUMPTABLE;
  void *pvVar2;
  
  UNRECOVERED_JUMPTABLE = (code *)gotcha_get_wrappee(gotcha_internal_libc_main_wrappee_handle);
  pvVar2 = gotcha_get_wrappee(gotcha_internal_main_wrappee_handle);
  iVar1 = (*UNRECOVERED_JUMPTABLE)(pvVar2,argc,argv,init,fini,rtld_fini);
  return iVar1;
}

Assistant:

int gotcha_internal_libc_start_main(int (*main_arg)(int, char **, char **)
                                        KNOWN_UNUSED,
                                    int argc, char **argv, void (*init)(),
                                    void (*fini)(), void (*rtld_fini)(),
                                    void *stack_end) {
  libc_start_main_t underlying_libc_main =
      gotcha_get_wrappee(gotcha_internal_libc_main_wrappee_handle);
  main_t underlying_main =
      gotcha_get_wrappee(gotcha_internal_main_wrappee_handle);
  return underlying_libc_main(underlying_main, argc, argv, init, fini,
                              rtld_fini, stack_end);
}